

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

void test_notify_three_event_and_remove(void)

{
  cio_error cVar1;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [2];
  cio_event_notifier forth_ev;
  cio_event_notifier third_ev;
  cio_event_notifier second_ev;
  cio_event_notifier first_ev;
  cio_eventloop loop;
  _func_int_int_int_int_epoll_event_ptr *local_598;
  code *pcStack_590;
  cio_event_notifier local_580;
  cio_event_notifier local_560;
  cio_event_notifier local_540;
  cio_event_notifier local_520;
  cio_eventloop local_500;
  
  epoll_ctl_fake.custom_fake_seq = &local_598;
  epoll_wait_fake.custom_fake = notify_four_fds;
  local_598 = epoll_ctl_nosave;
  pcStack_590 = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq_len = 2;
  memset(&local_500,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_500);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x336,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x337,UNITY_DISPLAY_STYLE_INT);
  epoll_callback_remove_third_fd_fake.custom_fake = remove_third_fd;
  local_520.fd = 0x2a;
  local_520.read_callback = epoll_callback_remove_third_fd;
  local_520.context = &local_500;
  cVar1 = cio_linux_eventloop_add(&local_500,&local_520);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x340,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (3,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x341,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x342,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x343,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x344,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_500,&local_520);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x346,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x347,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x348,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x349,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x34a,UNITY_DISPLAY_STYLE_INT);
  local_540.fd = 0x2b;
  local_540.read_callback = epoll_callback_second_fd;
  local_540.context = &local_500;
  cVar1 = cio_linux_eventloop_add(&local_500,&local_540);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x352,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x353,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x354,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2b,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x355,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_500,&local_540);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x357,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (6,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x358,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x359,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x35a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2b,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x35b,UNITY_DISPLAY_STYLE_INT);
  local_560.fd = 0x2c;
  local_560.read_callback = epoll_callback_third_fd;
  local_560.context = &local_500;
  cVar1 = cio_linux_eventloop_add(&local_500,&local_560);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x363,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x364,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x365,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2c,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x366,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_500,&local_560);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x368,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (8,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x369,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x36a,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x36b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2c,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x36c,UNITY_DISPLAY_STYLE_INT);
  local_580.fd = 0x2c;
  local_580.read_callback = epoll_callback_forth_fd;
  local_580.context = &local_500;
  cVar1 = cio_linux_eventloop_add(&local_500,&local_580);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x374,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x375,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x376,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2c,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x377,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_read(&local_500,&local_580);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x379,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (10,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x37a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)local_500.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x37b,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x37c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2c,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x37d,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_run(&local_500);
  UnityAssertEqualNumber
            (1,(ulong)epoll_callback_remove_third_fd_fake.call_count,(char *)0x0,0x380,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_500,(UNITY_INT)epoll_callback_remove_third_fd_fake.arg0_val,
             (char *)0x0,0x381,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_callback_second_fd_fake.call_count,(char *)0x0,0x382,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)epoll_callback_third_fd_fake.call_count,(char *)0x0,899,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_callback_forth_fd_fake.call_count,(char *)0x0,900,
             UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_destroy(&local_500);
  UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x387,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_notify_three_event_and_remove(void)
{
	epoll_wait_fake.custom_fake = notify_four_fds;
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_nosave, epoll_ctl_save};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	static const int fake_first_fd = 42;
	struct cio_event_notifier first_ev;
	epoll_callback_remove_third_fd_fake.custom_fake = remove_third_fd;
	first_ev.fd = fake_first_fd;
	first_ev.read_callback = epoll_callback_remove_third_fd;
	first_ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &first_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(3, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_first_fd, epoll_ctl_fake.arg2_val);
	err = cio_linux_eventloop_register_read(&loop, &first_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_first_fd, epoll_ctl_fake.arg2_val);

	static const int fake_second_fd = 43;
	struct cio_event_notifier second_ev;
	second_ev.fd = fake_second_fd;
	second_ev.read_callback = epoll_callback_second_fd;
	second_ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &second_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_second_fd, epoll_ctl_fake.arg2_val);
	err = cio_linux_eventloop_register_read(&loop, &second_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(6, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_second_fd, epoll_ctl_fake.arg2_val);

	static const int fake_third_fd = 44;
	struct cio_event_notifier third_ev;
	third_ev.fd = fake_third_fd;
	third_ev.read_callback = epoll_callback_third_fd;
	third_ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &third_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_third_fd, epoll_ctl_fake.arg2_val);
	err = cio_linux_eventloop_register_read(&loop, &third_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(8, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_third_fd, epoll_ctl_fake.arg2_val);

	static const int fake_forth_fd = 44;
	struct cio_event_notifier forth_ev;
	forth_ev.fd = fake_forth_fd;
	forth_ev.read_callback = epoll_callback_forth_fd;
	forth_ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &forth_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_forth_fd, epoll_ctl_fake.arg2_val);
	err = cio_linux_eventloop_register_read(&loop, &forth_ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(10, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_forth_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_run(&loop);
	TEST_ASSERT_EQUAL(1, epoll_callback_remove_third_fd_fake.call_count);
	TEST_ASSERT_EQUAL(&loop, epoll_callback_remove_third_fd_fake.arg0_val);
	TEST_ASSERT_EQUAL(1, epoll_callback_second_fd_fake.call_count);
	TEST_ASSERT_EQUAL(0, epoll_callback_third_fd_fake.call_count);
	TEST_ASSERT_EQUAL(1, epoll_callback_forth_fd_fake.call_count);

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}